

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

int array_container_intersection_cardinality(array_container_t *array1,array_container_t *array2)

{
  int iVar1;
  int iVar2;
  _Bool _Var3;
  int32_t iVar4;
  size_t size_l;
  uint16_t *large;
  size_t lenB;
  uint16_t *small;
  size_t lenA;
  
  iVar1 = array1->cardinality;
  lenA = (size_t)iVar1;
  iVar2 = array2->cardinality;
  lenB = (size_t)iVar2;
  if (iVar1 * 0x40 < iVar2) {
    small = array1->array;
    large = array2->array;
    size_l = lenB;
    lenB = lenA;
  }
  else {
    if (iVar1 <= iVar2 * 0x40) {
      _Var3 = croaring_avx2();
      if (_Var3) {
        iVar4 = intersect_vector16_cardinality(array1->array,lenA,array2->array,lenB);
        return iVar4;
      }
      iVar4 = intersect_uint16_cardinality(array1->array,lenA,array2->array,lenB);
      return iVar4;
    }
    small = array2->array;
    large = array1->array;
    size_l = lenA;
  }
  iVar4 = intersect_skewed_uint16_cardinality(small,lenB,large,size_l);
  return iVar4;
}

Assistant:

int array_container_intersection_cardinality(const array_container_t *array1,
                                             const array_container_t *array2) {
    int32_t card_1 = array1->cardinality, card_2 = array2->cardinality;
    const int threshold = 64;  // subject to tuning
    if (card_1 * threshold < card_2) {
        return intersect_skewed_uint16_cardinality(array1->array, card_1,
                                                   array2->array, card_2);
    } else if (card_2 * threshold < card_1) {
        return intersect_skewed_uint16_cardinality(array2->array, card_2,
                                                   array1->array, card_1);
    } else {
#ifdef CROARING_IS_X64
    if( croaring_avx2() ) {
        return intersect_vector16_cardinality(array1->array, card_1,
                                              array2->array, card_2);
    } else {
        return intersect_uint16_cardinality(array1->array, card_1,
                                            array2->array, card_2);
    }
#else
        return intersect_uint16_cardinality(array1->array, card_1,
                                            array2->array, card_2);
#endif
    }
}